

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QWindowSystemInterface::TouchPoint*>,long_long>
               (reverse_iterator<QWindowSystemInterface::TouchPoint_*> first,longlong n,
               reverse_iterator<QWindowSystemInterface::TouchPoint_*> d_first)

{
  Data *pDVar1;
  QPointF *pQVar2;
  qsizetype qVar3;
  undefined4 uVar4;
  reverse_iterator<QWindowSystemInterface::TouchPoint_*> *prVar5;
  TouchPoint *pTVar6;
  long lVar7;
  TouchPoint *pTVar8;
  TouchPoint *pTVar9;
  TouchPoint *pTVar10;
  TouchPoint *pTVar11;
  TouchPoint *pTVar12;
  TouchPoint *pTVar13;
  long in_FS_OFFSET;
  byte bVar14;
  Destructor local_48;
  long local_30;
  
  bVar14 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  local_48.end.current = *d_first.current;
  pTVar12 = local_48.end.current + -n;
  pTVar6 = *first.current;
  pTVar8 = local_48.end.current;
  pTVar10 = pTVar12;
  pTVar13 = pTVar6;
  if (pTVar12 < pTVar6) {
    pTVar10 = pTVar6;
    pTVar13 = pTVar12;
  }
  while (pTVar8 != pTVar10) {
    pTVar9 = pTVar6 + -1;
    pTVar11 = pTVar8 + -1;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar4 = *(undefined4 *)&pTVar9->field_0x4;
      pTVar11->id = pTVar9->id;
      *(undefined4 *)&pTVar11->field_0x4 = uVar4;
      pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
      pTVar11 = (TouchPoint *)&pTVar11->uniqueId;
    }
    pTVar8[-1].velocity.v[1] = pTVar6[-1].velocity.v[1];
    pDVar1 = pTVar6[-1].rawPositions.d.d;
    pTVar6[-1].rawPositions.d.d = (Data *)0x0;
    pTVar8[-1].rawPositions.d.d = pDVar1;
    pQVar2 = pTVar6[-1].rawPositions.d.ptr;
    pTVar6[-1].rawPositions.d.ptr = (QPointF *)0x0;
    pTVar8[-1].rawPositions.d.ptr = pQVar2;
    qVar3 = pTVar6[-1].rawPositions.d.size;
    pTVar6[-1].rawPositions.d.size = 0;
    pTVar8[-1].rawPositions.d.size = qVar3;
    *(long *)d_first.current = *(long *)d_first.current + -0x78;
    pTVar6 = (TouchPoint *)(*(long *)first.current - 0x78);
    *(TouchPoint **)first.current = pTVar6;
    pTVar8 = *d_first.current;
  }
  local_48.intermediate.current = pTVar8;
  while (prVar5 = &local_48.end, pTVar8 != pTVar12) {
    pTVar10 = pTVar6 + -1;
    pTVar9 = pTVar8 + -1;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar4 = *(undefined4 *)&pTVar10->field_0x4;
      pTVar9->id = pTVar10->id;
      *(undefined4 *)&pTVar9->field_0x4 = uVar4;
      pTVar10 = (TouchPoint *)((long)pTVar10 + (ulong)bVar14 * -0x10 + 8);
      pTVar9 = (TouchPoint *)((long)pTVar9 + (ulong)bVar14 * -0x10 + 8);
    }
    pTVar8[-1].velocity.v[1] = pTVar6[-1].velocity.v[1];
    QArrayDataPointer<QPointF>::operator=(&pTVar8[-1].rawPositions.d,&pTVar6[-1].rawPositions.d);
    *(long *)d_first.current = *(long *)d_first.current + -0x78;
    pTVar6 = (TouchPoint *)(*(long *)first.current - 0x78);
    *(TouchPoint **)first.current = pTVar6;
    pTVar8 = *d_first.current;
  }
  while (local_48.iter = prVar5, pTVar6 != pTVar13) {
    *(TouchPoint **)first.current = pTVar6 + 1;
    pDVar1 = (pTVar6->rawPositions).d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pTVar6->rawPositions).d.d)->super_QArrayData,0x10,0x10);
      }
    }
    prVar5 = local_48.iter;
    pTVar6 = *first.current;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QWindowSystemInterface::TouchPoint_*>,_long_long>
  ::Destructor::~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}